

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O1

int BIO_indent(BIO *b,int indent,int max)

{
  int iVar1;
  int iVar2;
  
  if ((uint)indent < (uint)max) {
    max = indent;
  }
  iVar2 = max + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return 1;
    }
    iVar1 = BIO_puts(b," ");
  } while (iVar1 == 1);
  return 0;
}

Assistant:

int BIO_indent(BIO *bio, unsigned indent, unsigned max_indent) {
  if (indent > max_indent) {
    indent = max_indent;
  }

  while (indent--) {
    if (BIO_puts(bio, " ") != 1) {
      return 0;
    }
  }
  return 1;
}